

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall pbrt::ParsedScene::ObjectInstance(ParsedScene *this,string *name,FileLoc loc)

{
  float fVar1;
  float fVar2;
  Float startTime;
  FileLoc loc_00;
  FileLoc loc_01;
  size_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Transform *pTVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  Transform worldFromRender;
  AnimatedTransform animatedRenderFromInstance;
  Transform local_848;
  InstanceSceneEntity local_7c8;
  Transform local_468;
  Transform local_3e8;
  Transform local_368;
  AnimatedTransform local_2e8;
  
  if (this->currentBlock == OptionsBlock) {
    ErrorExit<char_const(&)[15]>
              (&loc,"Scene description must be inside world block; \"%s\" is not allowed.",
               (char (*) [15])"ObjectInstance");
  }
  if (this->currentInstance == (InstanceDefinitionSceneEntity *)0x0) {
    local_848.m.m[0]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[0];
    local_848.m.m[0]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[0] + 2);
    local_848.m.m[1]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[1];
    local_848.m.m[1]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[1] + 2);
    local_848.m.m[2]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[2];
    local_848.m.m[2]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[2] + 2);
    local_848.m.m[3]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[3];
    local_848.m.m[3]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[3] + 2);
    pTVar7 = (this->graphicsState).ctm.t + 1;
    bVar10 = true;
    uVar8 = 0;
    local_848.mInv.m[0]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[0];
    local_848.mInv.m[0]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[0] + 2);
    local_848.mInv.m[1]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[1];
    local_848.mInv.m[1]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[1] + 2);
    local_848.mInv.m[2]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[2];
    local_848.mInv.m[2]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[2] + 2);
    local_848.mInv.m[3]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[3];
    local_848.mInv.m[3]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[3] + 2);
    do {
      lVar9 = 0;
      do {
        fVar1 = (pTVar7->m).m[0][lVar9];
        fVar2 = ((TransformSet *)(pTVar7 + -1))->t[0].m.m[0][lVar9];
        if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
          if (!bVar10) goto LAB_001d8d6c;
          RenderFromObject(&local_368,this,0);
          pbrt::Transform::operator*((Transform *)&local_7c8,&local_368,&local_848);
          startTime = (this->graphicsState).transformStartTime;
          RenderFromObject(&local_468,this,1);
          pbrt::Transform::operator*(&local_3e8,&local_468,&local_848);
          AnimatedTransform::AnimatedTransform
                    (&local_2e8,(Transform *)&local_7c8,startTime,&local_3e8,
                     (this->graphicsState).transformEndTime);
          loc_00.filename._M_str = loc.filename._M_str;
          loc_00.filename._M_len = loc.filename._M_len;
          loc_00.line = loc.line;
          loc_00.column = loc.column;
          InstanceSceneEntity::InstanceSceneEntity
                    (&local_7c8,name,loc_00,&local_2e8,(Transform *)0x0);
          std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::
          emplace_back<pbrt::InstanceSceneEntity>(&this->instances,&local_7c8);
          goto LAB_001d8e24;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      bVar10 = uVar8 < 3;
      uVar8 = uVar8 + 1;
      pTVar7 = (Transform *)((pTVar7->m).m + 1);
    } while (uVar8 != 4);
LAB_001d8d6c:
    RenderFromObject(&local_2e8.startTransform,this,0);
    pbrt::Transform::operator*((Transform *)&local_7c8,&local_2e8.startTransform,&local_848);
    pTVar7 = TransformCache::Lookup(&this->transformCache,(Transform *)&local_7c8);
    uVar5 = loc._16_8_;
    pcVar4 = loc.filename._M_str;
    sVar3 = loc.filename._M_len;
    memset(&local_2e8,0,0x2b8);
    AnimatedTransform::AnimatedTransform(&local_2e8);
    uVar6 = loc._16_8_;
    loc_01.filename._M_str = pcVar4;
    loc_01.filename._M_len = sVar3;
    loc.line = (int)uVar5;
    loc.column = SUB84(uVar5,4);
    loc_01.line = loc.line;
    loc_01.column = loc.column;
    loc._16_8_ = uVar6;
    InstanceSceneEntity::InstanceSceneEntity(&local_7c8,name,loc_01,&local_2e8,pTVar7);
    std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::
    emplace_back<pbrt::InstanceSceneEntity>(&this->instances,&local_7c8);
LAB_001d8e24:
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_7c8.super_SceneEntity.parameters.params);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8.super_SceneEntity.name._M_dataplus._M_p !=
        &local_7c8.super_SceneEntity.name.field_2) {
      operator_delete(local_7c8.super_SceneEntity.name._M_dataplus._M_p,
                      local_7c8.super_SceneEntity.name.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (this->super_SceneRepresentation).errorExit = true;
    Error(&loc,"ObjectInstance can\'t be called inside instance definition");
  }
  return;
}

Assistant:

void ParsedScene::ObjectInstance(const std::string &name, FileLoc loc) {
    VERIFY_WORLD("ObjectInstance");

    if (currentInstance != nullptr) {
        ErrorExitDeferred(&loc,
                          "ObjectInstance can't be called inside instance definition");
        return;
    }

    class Transform worldFromRender = Inverse(renderFromWorld);

    if (CTMIsAnimated()) {
        AnimatedTransform animatedRenderFromInstance(
            RenderFromObject(0) * worldFromRender, graphicsState.transformStartTime,
            RenderFromObject(1) * worldFromRender, graphicsState.transformEndTime);

        instances.push_back(
            InstanceSceneEntity(name, loc, animatedRenderFromInstance, nullptr));
    } else {
        const class Transform *renderFromInstance =
            transformCache.Lookup(RenderFromObject(0) * worldFromRender);

        instances.push_back(
            InstanceSceneEntity(name, loc, AnimatedTransform(), renderFromInstance));
    }
}